

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::next_alternative(depth_first_traverser *this)

{
  bool bVar1;
  __normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
  local_60;
  const_iterator local_58;
  __normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
  local_50;
  const_iterator local_48;
  undefined1 local_40 [24];
  reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
  i;
  depth_first_traverser *this_local;
  
  i.current._M_current =
       (__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
        )(__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
          )this;
  bVar1 = std::
          vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ::empty(&this->stack_);
  if (!bVar1) {
    std::
    vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ::rbegin((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              *)&stack0xffffffffffffffd8);
    std::
    vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ::rend((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            *)(local_40 + 0x10));
    std::
    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>>,clipp::group::depth_first_traverser::next_alternative()::_lambda(clipp::group::depth_first_traverser::context_const&)_1_>
              (&stack0xffffffffffffffe0,&stack0xffffffffffffffd8,local_40 + 0x10);
    std::
    vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ::rend((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            *)local_40);
    bVar1 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                             *)&stack0xffffffffffffffe0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                             *)local_40);
    if (!bVar1) {
      local_50._M_current =
           (context *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
           ::base((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                   *)&stack0xffffffffffffffe0);
      __gnu_cxx::
      __normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>
      ::__normal_iterator<clipp::group::depth_first_traverser::context*>
                ((__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>
                  *)&local_48,&local_50);
      local_60._M_current =
           (context *)
           std::
           vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ::end(&this->stack_);
      __gnu_cxx::
      __normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>
      ::__normal_iterator<clipp::group::depth_first_traverser::context*>
                ((__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>
                  *)&local_58,&local_60);
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::erase(&this->stack_,local_48,local_58);
      next_sibling(this);
    }
  }
  return this;
}

Assistant:

depth_first_traverser&
        next_alternative() {
            if(stack_.empty()) return *this;

            //find first exclusive group (from the top of the stack!)
            auto i = std::find_if(stack_.rbegin(), stack_.rend(),
                [](const context& c) { return c.parent->exclusive(); });
            if(i == stack_.rend()) return *this;

            stack_.erase(i.base(), stack_.end());
            next_sibling();
            return *this;
        }